

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_source_out(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  uint32_t d;
  uint32_t s;
  int i_1;
  uint32_t cia;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = BYTE_MUL(src[i_1],(dest[i_1] ^ 0xffffffff) >> 0x18);
      dest[i_1] = uVar1;
    }
  }
  else {
    for (d = 0; (int)d < length; d = d + 1) {
      uVar1 = BYTE_MUL(src[(int)d],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(uVar1,(dest[(int)d] ^ 0xffffffff) >> 0x18,dest[(int)d],
                                0xff - const_alpha);
      dest[(int)d] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_source_out(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(src[i], plutovg_alpha(~dest[i]));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(~d), d, cia);
        }
    }
}